

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O2

uint64_t duckdb::alp::AlpCompression<double,_false>::DryCompressToEstimateSize<false>
                   (vector<double,_true> *input_vector,AlpEncodingIndices encoding_indices)

{
  double *pdVar1;
  double *pdVar2;
  int64_t encoded_value;
  long lVar3;
  const_iterator __begin0;
  double *pdVar4;
  long lVar5;
  const_iterator __end0;
  double dVar6;
  __type_conflict6 __x;
  long local_40;
  
  lVar5 = 0x7fffffffffffffff;
  pdVar1 = (input_vector->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (input_vector->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar3 = -0x8000000000000000;
  local_40 = 0;
  for (pdVar4 = pdVar1; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
    encoded_value = EncodeValue(*pdVar4,encoding_indices);
    dVar6 = DecodeValue(encoded_value,encoding_indices);
    if ((dVar6 != *pdVar4) || (NAN(dVar6) || NAN(*pdVar4))) {
      local_40 = local_40 + 1;
    }
    else {
      if (lVar3 < encoded_value) {
        lVar3 = encoded_value;
      }
      if (encoded_value < lVar5) {
        lVar5 = encoded_value;
      }
    }
  }
  __x = ::std::log2<unsigned_long>((lVar3 - lVar5) + 1);
  dVar6 = ceil(__x);
  return local_40 * 0x50 + ((long)dVar6 & 0xffffffffU) * ((long)pdVar2 - (long)pdVar1 >> 3);
}

Assistant:

static uint64_t DryCompressToEstimateSize(const vector<T> &input_vector, AlpEncodingIndices encoding_indices) {
		idx_t n_values = input_vector.size();
		idx_t exceptions_count = 0;
		idx_t non_exceptions_count = 0;
		uint32_t estimated_bits_per_value = 0;
		uint64_t estimated_compression_size = 0;
		int64_t max_encoded_value = NumericLimits<int64_t>::Minimum();
		int64_t min_encoded_value = NumericLimits<int64_t>::Maximum();

		for (const T &value : input_vector) {
			int64_t encoded_value = EncodeValue(value, encoding_indices);
			T decoded_value = DecodeValue(encoded_value, encoding_indices);
			if (decoded_value == value) {
				non_exceptions_count++;
				max_encoded_value = MaxValue(encoded_value, max_encoded_value);
				min_encoded_value = MinValue(encoded_value, min_encoded_value);
				continue;
			}
			exceptions_count++;
		}

		// We penalize combinations which yields to almost all exceptions
		if (PENALIZE_EXCEPTIONS && non_exceptions_count < 2) {
			return NumericLimits<uint64_t>::Maximum();
		}

		// Evaluate factor/exponent compression size (we optimize for FOR)
		uint64_t delta = (static_cast<uint64_t>(max_encoded_value) - static_cast<uint64_t>(min_encoded_value));
		estimated_bits_per_value = ExactNumericCast<uint32_t>(std::ceil(std::log2(delta + 1)));
		estimated_compression_size += n_values * estimated_bits_per_value;
		estimated_compression_size +=
		    exceptions_count * (EXACT_TYPE_BITSIZE + (AlpConstants::EXCEPTION_POSITION_SIZE * 8));
		return estimated_compression_size;
	}